

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperCut.c
# Opt level: O2

Map_Cut_t * Map_CutSortCuts(Map_Man_t *pMan,Map_CutTable_t *p,Map_Cut_t *pList)

{
  Map_Cut_t **ppMVar1;
  Map_Cut_t *pMVar2;
  uint uVar3;
  ulong uVar4;
  Map_Cut_t *pMVar5;
  ulong uVar6;
  Map_Cut_t *pListNew;
  
  uVar3 = Map_CutList2Array(p->pCuts1,pList);
  if ((int)uVar3 < 0x3e9) {
    qsort(p->pCuts1,(long)(int)uVar3,8,Map_CutSortCutsCompare);
    if (0xf9 < (int)uVar3) {
      for (uVar6 = 0xf9; uVar3 != uVar6; uVar6 = uVar6 + 1) {
        Extra_MmFixedEntryRecycle(pMan->mmCuts,(char *)p->pCuts1[uVar6]);
      }
      uVar3 = 0xf9;
    }
    ppMVar1 = p->pCuts1;
    pListNew = (Map_Cut_t *)0x0;
    uVar4 = 0;
    pMVar5 = (Map_Cut_t *)&pListNew;
    uVar6 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      pMVar5 = (Map_Cut_t *)&pListNew;
      uVar6 = uVar4;
    }
    for (; uVar6 != uVar4; uVar4 = uVar4 + 1) {
      pMVar2 = ppMVar1[uVar4];
      pMVar5->pNext = pMVar2;
      pMVar5 = pMVar2;
    }
    pMVar5->pNext = (Map_Cut_t *)0x0;
    return pListNew;
  }
  __assert_fail("nCuts <= MAP_CUTS_MAX_COMPUTE",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperCut.c"
                ,0x3ef,"Map_Cut_t *Map_CutSortCuts(Map_Man_t *, Map_CutTable_t *, Map_Cut_t *)");
}

Assistant:

Map_Cut_t * Map_CutSortCuts( Map_Man_t * pMan, Map_CutTable_t * p, Map_Cut_t * pList )
{
    Map_Cut_t * pListNew;
    int nCuts, i;
//    abctime clk;
    // move the cuts from the list into the array
    nCuts = Map_CutList2Array( p->pCuts1, pList );
    assert( nCuts <= MAP_CUTS_MAX_COMPUTE );
    // sort the cuts
//clk = Abc_Clock();
    qsort( (void *)p->pCuts1, (size_t)nCuts, sizeof(Map_Cut_t *), 
            (int (*)(const void *, const void *)) Map_CutSortCutsCompare );
//pMan->time2 += Abc_Clock() - clk;
    // move them back into the list
    if ( nCuts > MAP_CUTS_MAX_USE - 1 )
    {
        // free the remaining cuts
        for ( i = MAP_CUTS_MAX_USE - 1; i < nCuts; i++ )
            Extra_MmFixedEntryRecycle( pMan->mmCuts, (char *)p->pCuts1[i] );
        // update the number of cuts
        nCuts = MAP_CUTS_MAX_USE - 1;
    }
    pListNew = Map_CutArray2List( p->pCuts1, nCuts );
    return pListNew;
}